

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O2

int * Tru_ManLookup(Tru_Man_t *p,word *pTruth)

{
  Tru_One_t *pTVar1;
  long lVar2;
  uint uVar3;
  Tru_One_t *pTVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  
  if ((*pTruth & 1) != 0) {
    __assert_fail("(pTruth[0] & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                  ,0x62,"int *Tru_ManLookup(Tru_Man_t *, word *)");
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)p->nWords;
  if (p->nWords < 1) {
    uVar6 = uVar5;
  }
  uVar3 = 0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = uVar3 ^ Tru_ManLookup::s_Primes[(uint)uVar5 & 7] * (int)pTruth[uVar5];
  }
  piVar7 = p->pTable + (ulong)uVar3 % (ulong)(uint)p->nTableSize;
  do {
    pTVar4 = Tru_ManReadOne(p,*piVar7);
    if (pTVar4 == (Tru_One_t *)0x0) {
      return piVar7;
    }
    uVar5 = 0;
    do {
      if (uVar6 == uVar5) {
        return piVar7;
      }
      lVar2 = uVar5 + 1;
      pTVar1 = (Tru_One_t *)(pTruth + uVar5);
      uVar5 = uVar5 + 1;
    } while (pTVar4[lVar2] == *pTVar1);
    piVar7 = &pTVar4->Next;
  } while( true );
}

Assistant:

int * Tru_ManLookup( Tru_Man_t * p, word * pTruth )
{
    static int s_Primes[10] = { 1291, 1699, 2357, 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    Tru_One_t * pEntry;
    int * pSpot;
    assert( (pTruth[0] & 1) == 0 );
    pSpot = p->pTable + Tru_ManHash( pTruth, p->nWords, p->nTableSize, s_Primes );
    for ( pEntry = Tru_ManReadOne(p, *pSpot); pEntry; pSpot = &pEntry->Next, pEntry = Tru_ManReadOne(p, *pSpot) )
        if ( Tru_ManEqual(pEntry->pTruth, pTruth, p->nWords) )
            return pSpot;
    return pSpot;
}